

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O3

int __thiscall lightconf::writer::writer(writer *this,UI *ui,UI_STRING *uis)

{
  int extraout_EAX;
  undefined4 local_6c;
  _Deque_base<int,_std::allocator<int>_> local_68;
  
  (this->buf)._M_dataplus._M_p = (pointer)&(this->buf).field_2;
  (this->buf)._M_string_length = 0;
  (this->buf).field_2._M_local_buf[0] = '\0';
  local_6c = 0;
  local_68._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::deque<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((deque<int,std::allocator<int>> *)&local_68,&local_6c);
  std::_Deque_base<int,_std::allocator<int>_>::_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&this->tabstops,&local_68);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_68);
  this->line = 0;
  this->col = 0;
  return extraout_EAX;
}

Assistant:

writer() :
        tabstops({0}),
        line(0),
        col(0)
    { }